

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Allocator.h
# Opt level: O1

void __thiscall
llvm::SpecificBumpPtrAllocator<wasm::SuffixTreeLeafNode>::DestroyAll
          (SpecificBumpPtrAllocator<wasm::SuffixTreeLeafNode> *this)

{
  void *pvVar1;
  ulong uVar2;
  byte bVar3;
  uint uVar4;
  ulong uVar5;
  pair<void_*,_unsigned_long> *PtrAndSize;
  ulong *puVar6;
  uintptr_t ArithAddr_1;
  long *plVar7;
  uintptr_t ArithAddr;
  long *plVar8;
  long *plVar9;
  ulong *puVar10;
  
  uVar2 = (ulong)(this->Allocator).Slabs.super_SmallVectorImpl<void_*>.
                 super_SmallVectorTemplateBase<void_*,_true>.
                 super_SmallVectorTemplateCommon<void_*,_void>.super_SmallVectorBase.Size;
  if (uVar2 != 0) {
    puVar10 = (ulong *)(this->Allocator).Slabs.super_SmallVectorImpl<void_*>.
                       super_SmallVectorTemplateBase<void_*,_true>.
                       super_SmallVectorTemplateCommon<void_*,_void>.super_SmallVectorBase.BeginX;
    puVar6 = puVar10 + uVar2;
    do {
      pvVar1 = (this->Allocator).Slabs.super_SmallVectorImpl<void_*>.
               super_SmallVectorTemplateBase<void_*,_true>.
               super_SmallVectorTemplateCommon<void_*,_void>.super_SmallVectorBase.BeginX;
      uVar4 = (uint)((ulong)((long)puVar10 - (long)pvVar1) >> 10) & 0x1ffffff;
      bVar3 = (byte)uVar4;
      if (0x1d < uVar4) {
        bVar3 = 0x1e;
      }
      uVar2 = *puVar10;
      if (0xfffffffffffffff8 < uVar2) goto LAB_008b172a;
      uVar5 = (ulong)(this->Allocator).Slabs.super_SmallVectorImpl<void_*>.
                     super_SmallVectorTemplateBase<void_*,_true>.
                     super_SmallVectorTemplateCommon<void_*,_void>.super_SmallVectorBase.Size;
      if (uVar5 == 0) {
        __assert_fail("!empty()",
                      "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/third_party/llvm-project/include/llvm/ADT/SmallVector.h"
                      ,0xa7,"reference llvm::SmallVectorTemplateCommon<void *>::back() [T = void *]"
                     );
      }
      if (uVar2 == *(ulong *)((long)pvVar1 + uVar5 * 8 + -8)) {
        plVar7 = (long *)(this->Allocator).CurPtr;
      }
      else {
        plVar7 = (long *)((0x1000L << (bVar3 & 0x3f)) + uVar2);
      }
      plVar8 = (long *)(uVar2 + 7 & 0xfffffffffffffff8);
      plVar9 = plVar8 + 4;
      while (plVar9 <= plVar7) {
        (**(code **)(*plVar8 + 8))(plVar8);
        plVar9 = plVar8 + 8;
        plVar8 = plVar8 + 4;
      }
      puVar10 = puVar10 + 1;
    } while (puVar10 != puVar6);
  }
  uVar2 = (ulong)(this->Allocator).CustomSizedSlabs.
                 super_SmallVectorImpl<std::pair<void_*,_unsigned_long>_>.
                 super_SmallVectorTemplateBase<std::pair<void_*,_unsigned_long>,_false>.
                 super_SmallVectorTemplateCommon<std::pair<void_*,_unsigned_long>,_void>.
                 super_SmallVectorBase.Size;
  if (uVar2 != 0) {
    puVar6 = (ulong *)(this->Allocator).CustomSizedSlabs.
                      super_SmallVectorImpl<std::pair<void_*,_unsigned_long>_>.
                      super_SmallVectorTemplateBase<std::pair<void_*,_unsigned_long>,_false>.
                      super_SmallVectorTemplateCommon<std::pair<void_*,_unsigned_long>,_void>.
                      super_SmallVectorBase.BeginX;
    puVar10 = puVar6 + uVar2 * 2;
    do {
      uVar2 = *puVar6;
      if (0xfffffffffffffff8 < uVar2) {
LAB_008b172a:
        __assert_fail("static_cast<uintptr_t>(ArithAddr + Alignment.value() - 1) >= ArithAddr && \"Overflow\""
                      ,
                      "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/third_party/llvm-project/include/llvm/Support/Alignment.h"
                      ,0xbb,"uintptr_t llvm::alignAddr(const void *, Align)");
      }
      plVar9 = (long *)(uVar2 + 7 & 0xfffffffffffffff8);
      uVar5 = puVar6[1];
      plVar7 = plVar9 + 4;
      while (plVar7 <= (long *)(uVar2 + uVar5)) {
        (**(code **)(*plVar9 + 8))(plVar9);
        plVar7 = plVar9 + 8;
        plVar9 = plVar9 + 4;
      }
      puVar6 = puVar6 + 2;
    } while (puVar6 != puVar10);
  }
  BumpPtrAllocatorImpl<llvm::MallocAllocator,_4096UL,_4096UL>::Reset(&this->Allocator);
  return;
}

Assistant:

void DestroyAll() {
    auto DestroyElements = [](char *Begin, char *End) {
      assert(Begin == (char *)alignAddr(Begin, Align::Of<T>()));
      for (char *Ptr = Begin; Ptr + sizeof(T) <= End; Ptr += sizeof(T))
        reinterpret_cast<T *>(Ptr)->~T();
    };

    for (auto I = Allocator.Slabs.begin(), E = Allocator.Slabs.end(); I != E;
         ++I) {
      size_t AllocatedSlabSize = BumpPtrAllocator::computeSlabSize(
          std::distance(Allocator.Slabs.begin(), I));
      char *Begin = (char *)alignAddr(*I, Align::Of<T>());
      char *End = *I == Allocator.Slabs.back() ? Allocator.CurPtr
                                               : (char *)*I + AllocatedSlabSize;

      DestroyElements(Begin, End);
    }

    for (auto &PtrAndSize : Allocator.CustomSizedSlabs) {
      void *Ptr = PtrAndSize.first;
      size_t Size = PtrAndSize.second;
      DestroyElements((char *)alignAddr(Ptr, Align::Of<T>()),
                      (char *)Ptr + Size);
    }

    Allocator.Reset();
  }